

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O1

Error __thiscall
asmjit::v1_14::BaseBuilder::embedLabelDelta
          (BaseBuilder *this,Label *label,Label *base,size_t dataSize)

{
  uint32_t uVar1;
  uint32_t uVar2;
  Error EVar3;
  Error extraout_EAX;
  Error EVar4;
  ulong uVar5;
  BaseNode *node;
  size_t local_30;
  
  if ((this->super_BaseEmitter)._code == (CodeHolder *)0x0) {
    return 5;
  }
  if ((dataSize != 0) &&
     ((8 < dataSize ||
      (uVar5 = dataSize - (dataSize >> 1 & 0x5555555555555555),
      uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333),
      1 < (byte)(((uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38))))) {
    EVar3 = BaseEmitter::reportError(&this->super_BaseEmitter,2,(char *)0x0);
    return EVar3;
  }
  if (*(long *)&this->_allocator == 0) {
    embedLabelDelta();
    EVar3 = extraout_EAX;
  }
  else {
    uVar1 = (label->super_Operand).super_Operand_._baseId;
    uVar2 = (base->super_Operand).super_Operand_._baseId;
    node = (BaseNode *)ZoneAllocator::_alloc(&this->_allocator,0x40,&local_30);
    EVar4 = 0;
    EVar3 = 0;
    if (node != (BaseNode *)0x0) {
      *(undefined8 *)node = 0;
      *(undefined8 *)(node + 8) = 0;
      node[0x10] = (BaseNode)0x7;
      node[0x11] = (BaseNode)(this->_nodeFlags | kIsData);
      *(undefined8 *)(node + 0x12) = 0;
      *(undefined8 *)(node + 0x1a) = 0;
      *(undefined8 *)(node + 0x20) = 0;
      *(undefined8 *)(node + 0x28) = 0;
      *(uint32_t *)(node + 0x30) = uVar1;
      *(uint32_t *)(node + 0x34) = uVar2;
      *(int *)(node + 0x38) = (int)dataSize;
      goto LAB_00117d67;
    }
  }
  EVar4 = EVar3;
  node = (BaseNode *)0x0;
LAB_00117d67:
  if (node == (BaseNode *)0x0) {
    EVar4 = BaseEmitter::reportError(&this->super_BaseEmitter,1,(char *)0x0);
  }
  if (EVar4 == 0) {
    addNode(this,node);
    EVar4 = 0;
  }
  return EVar4;
}

Assistant:

Error BaseBuilder::embedLabelDelta(const Label& label, const Label& base, size_t dataSize) {
  if (ASMJIT_UNLIKELY(!_code))
    return DebugUtils::errored(kErrorNotInitialized);

  if (!BaseBuilder_checkDataSize(dataSize))
    return reportError(DebugUtils::errored(kErrorInvalidArgument));

  EmbedLabelDeltaNode* node;
  ASMJIT_PROPAGATE(_newNodeT<EmbedLabelDeltaNode>(&node, label.id(), base.id(), uint32_t(dataSize)));

  addNode(node);
  return kErrorOk;
}